

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void google::protobuf::ShutdownProtobufLibrary(void)

{
  _Vector_base<void_(*)(),_std::allocator<void_(*)()>_> *p_Var1;
  Mutex *pMVar2;
  reference pp_Var3;
  int i;
  ulong __n;
  
  internal::InitShutdownFunctionsOnce();
  if (internal::shutdown_functions != (_Vector_base<void_(*)(),_std::allocator<void_(*)()>_> *)0x0)
  {
    for (__n = 0; p_Var1 = internal::shutdown_functions,
        __n < (ulong)((long)(internal::shutdown_functions->_M_impl).super__Vector_impl_data.
                            _M_finish -
                      (long)(internal::shutdown_functions->_M_impl).super__Vector_impl_data._M_start
                     >> 3); __n = __n + 1) {
      pp_Var3 = std::vector<void_(*)(),_std::allocator<void_(*)()>_>::at
                          ((vector<void_(*)(),_std::allocator<void_(*)()>_> *)
                           internal::shutdown_functions,__n);
      (**pp_Var3)();
    }
    std::_Vector_base<void_(*)(),_std::allocator<void_(*)()>_>::~_Vector_base
              (internal::shutdown_functions);
    operator_delete(p_Var1,0x18);
    pMVar2 = internal::shutdown_functions_mutex;
    internal::shutdown_functions = (_Vector_base<void_(*)(),_std::allocator<void_(*)()>_> *)0x0;
    if (internal::shutdown_functions_mutex != (Mutex *)0x0) {
      internal::Mutex::~Mutex(internal::shutdown_functions_mutex);
    }
    operator_delete(pMVar2,8);
    internal::shutdown_functions_mutex = (Mutex *)0x0;
  }
  return;
}

Assistant:

void ShutdownProtobufLibrary() {
  internal::InitShutdownFunctionsOnce();

  // We don't need to lock shutdown_functions_mutex because it's up to the
  // caller to make sure that no one is using the library before this is
  // called.

  // Make it safe to call this multiple times.
  if (internal::shutdown_functions == NULL) return;

  for (int i = 0; i < internal::shutdown_functions->size(); i++) {
    internal::shutdown_functions->at(i)();
  }
  delete internal::shutdown_functions;
  internal::shutdown_functions = NULL;
  delete internal::shutdown_functions_mutex;
  internal::shutdown_functions_mutex = NULL;
}